

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode hostname_check(Curl_URL *u,char *hostname,size_t hlen)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  char *__s;
  char *pcVar7;
  char zoneid [16];
  char dest [16];
  
  if (*hostname == '\0') {
    return CURLUE_NO_HOST;
  }
  if (*hostname == '[') {
    if (hlen < 4) {
      return CURLUE_BAD_IPV6;
    }
    if (hostname[hlen - 1] != ']') {
      return CURLUE_BAD_IPV6;
    }
    __s = hostname + 1;
    sVar3 = strspn(__s,"0123456789abcdefABCDEF:.");
    sVar5 = hlen - 2;
    if (hlen - 2 != sVar3) {
      if (__s[sVar3] != '%') {
        return CURLUE_BAD_IPV6;
      }
      pcVar7 = __s + sVar3;
      pcVar4 = pcVar7 + 1;
      if ((((pcVar7[1] == '2') && (pcVar7[2] == '5')) && (pcVar7[3] != '\0')) && (pcVar7[3] != ']'))
      {
        pcVar4 = pcVar7 + 3;
      }
      uVar6 = 0;
      while( true ) {
        cVar1 = pcVar4[uVar6];
        if (cVar1 == '\0') {
          return CURLUE_MALFORMED_INPUT;
        }
        if ((cVar1 == ']') || (0xe < uVar6)) break;
        zoneid[uVar6] = cVar1;
        uVar6 = uVar6 + 1;
      }
      if (uVar6 == 0) {
        return CURLUE_MALFORMED_INPUT;
      }
      if (cVar1 != ']') {
        return CURLUE_MALFORMED_INPUT;
      }
      zoneid[uVar6] = '\0';
      pcVar4 = (*Curl_cstrdup)(zoneid);
      u->zoneid = pcVar4;
      if (pcVar4 == (char *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      pcVar7[0] = ']';
      pcVar7[1] = '\0';
      sVar5 = sVar3;
    }
    __s[sVar5] = '\0';
    iVar2 = inet_pton(10,__s,dest);
    if (iVar2 != 1) {
      return CURLUE_BAD_IPV6;
    }
    pcVar4 = inet_ntop(10,dest,zoneid,0x2e);
    if ((pcVar4 != (char *)0x0) && (sVar3 = strlen(zoneid), sVar3 < sVar5)) {
      strcpy(__s,zoneid);
      hostname[sVar3 + 2] = '\0';
      sVar5 = sVar3;
    }
    __s[sVar5] = ']';
  }
  else {
    sVar5 = strcspn(hostname," \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,");
    if (sVar5 != hlen) {
      return CURLUE_BAD_HOSTNAME;
    }
  }
  return CURLUE_OK;
}

Assistant:

static CURLUcode hostname_check(struct Curl_URL *u, char *hostname,
                                size_t hlen) /* length of hostname */
{
  size_t len;
  DEBUGASSERT(hostname);

  if(!hostname[0])
    return CURLUE_NO_HOST;
  else if(hostname[0] == '[') {
    const char *l = "0123456789abcdefABCDEF:.";
    if(hlen < 4) /* '[::]' is the shortest possible valid string */
      return CURLUE_BAD_IPV6;
    hostname++;
    hlen -= 2;

    if(hostname[hlen] != ']')
      return CURLUE_BAD_IPV6;

    /* only valid letters are ok */
    len = strspn(hostname, l);
    if(hlen != len) {
      hlen = len;
      if(hostname[len] == '%') {
        /* this could now be '%[zone id]' */
        char zoneid[16];
        int i = 0;
        char *h = &hostname[len + 1];
        /* pass '25' if present and is a url encoded percent sign */
        if(!strncmp(h, "25", 2) && h[2] && (h[2] != ']'))
          h += 2;
        while(*h && (*h != ']') && (i < 15))
          zoneid[i++] = *h++;
        if(!i || (']' != *h))
          /* impossible to reach? */
          return CURLUE_MALFORMED_INPUT;
        zoneid[i] = 0;
        u->zoneid = strdup(zoneid);
        if(!u->zoneid)
          return CURLUE_OUT_OF_MEMORY;
        hostname[len] = ']'; /* insert end bracket */
        hostname[len + 1] = 0; /* terminate the hostname */
      }
      else
        return CURLUE_BAD_IPV6;
      /* hostname is fine */
    }
#ifdef ENABLE_IPV6
    {
      char dest[16]; /* fits a binary IPv6 address */
      char norm[MAX_IPADR_LEN];
      hostname[hlen] = 0; /* end the address there */
      if(1 != Curl_inet_pton(AF_INET6, hostname, dest))
        return CURLUE_BAD_IPV6;

      /* check if it can be done shorter */
      if(Curl_inet_ntop(AF_INET6, dest, norm, sizeof(norm)) &&
         (strlen(norm) < hlen)) {
        strcpy(hostname, norm);
        hlen = strlen(norm);
        hostname[hlen + 1] = 0;
      }
      hostname[hlen] = ']'; /* restore ending bracket */
    }
#endif
  }
  else {
    /* letters from the second string are not ok */
    len = strcspn(hostname, " \r\n\t/:#?!@{}[]\\$\'\"^`*<>=;,");
    if(hlen != len)
      /* hostname with bad content */
      return CURLUE_BAD_HOSTNAME;
  }
  return CURLUE_OK;
}